

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

string * __thiscall test_mean::vars_abi_cxx11_(test_mean *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_c0 [12];
  ggml_type in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_a0 [8];
  array<long,_4UL> *in_stack_ffffffffffffff68;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  var_to_str_abi_cxx11_(in_stack_ffffffffffffff4c);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long,4ul>(in_stack_ffffffffffffff68);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return __lhs;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR2(type, ne);
    }